

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

TestCaseGroup * vkt::image::createImageSizeTests(TestContext *testCtx)

{
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  char *name;
  TestNode *pTVar3;
  SizeTest *this;
  TestNode *node;
  ImageType imageType;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  undefined1 local_8c [8];
  Texture texture;
  int imageSizeNdx;
  int flagNdx;
  undefined1 local_48 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageGroup;
  int imageTypeNdx;
  VkFormat format;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"image_size","imageSize() cases");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&imageTypeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = 0x6d;
  for (imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._8_4_ = 0;
      (int)imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data._8_4_ < 8;
      imageGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = imageGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    uVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
            m_data._8_8_;
    imageSizeNdx._3_1_ = 1;
    getImageTypeName_abi_cxx11_
              ((string *)&flagNdx,
               (image *)(ulong)*(uint *)((anonymous_namespace)::s_imageTypes +
                                        (long)(int)imageGroup.
                                                                                                      
                                                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                                  .m_data._8_4_ * 4),imageType);
    name = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar2,(TestContext *)uVar1,name,"");
    imageSizeNdx._3_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&imageSizeNdx + 2));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48,
               pTVar2);
    std::__cxx11::string::~string((string *)&flagNdx);
    for (texture.m_numSamples = 0; texture.m_numSamples < 3;
        texture.m_numSamples = texture.m_numSamples + 1) {
      for (texture.m_numLayers = 0; texture.m_numLayers < 4;
          texture.m_numLayers = texture.m_numLayers + 1) {
        anon_unknown_0::getTexture
                  ((Texture *)local_8c,
                   *(ImageType *)
                    ((anonymous_namespace)::s_imageTypes +
                    (long)(int)imageGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._8_4_ * 4),
                   (IVec3 *)((anonymous_namespace)::s_baseImageSizes +
                            (long)texture.m_numLayers * 0xc));
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_48)->super_TestNode;
        this = (SizeTest *)operator_new(0x90);
        uVar1 = testGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        (anonymous_namespace)::getCaseName_abi_cxx11_
                  (&local_b0,(_anonymous_namespace_ *)local_8c,
                   (Texture *)
                   (ulong)*(uint *)((anonymous_namespace)::s_flags + (long)texture.m_numSamples * 4)
                   ,texture.m_numSamples);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
        anon_unknown_0::SizeTest::SizeTest
                  (this,(TestContext *)uVar1,&local_b0,&local_d0,(Texture *)local_8c,
                   VK_FORMAT_R32G32B32A32_SFLOAT,
                   *(deUint32 *)((anonymous_namespace)::s_flags + (long)texture.m_numSamples * 4));
        tcu::TestNode::addChild(pTVar3,(TestNode *)this);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    node = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48
                   )->super_TestNode;
    tcu::TestNode::addChild(pTVar3,node);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createImageSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_size", "imageSize() cases"));

	const VkFormat format = VK_FORMAT_R32G32B32A32_SFLOAT;

	for (int imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(s_imageTypes); ++imageTypeNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(s_imageTypes[imageTypeNdx]).c_str(), ""));

		for (int flagNdx = 0; flagNdx < DE_LENGTH_OF_ARRAY(s_flags); ++flagNdx)
		for (int imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(s_baseImageSizes); ++imageSizeNdx)
		{
			const Texture texture = getTexture(s_imageTypes[imageTypeNdx], s_baseImageSizes[imageSizeNdx]);
			imageGroup->addChild(new SizeTest(testCtx, getCaseName(texture, s_flags[flagNdx]), "", texture, format, s_flags[flagNdx]));
		}

		testGroup->addChild(imageGroup.release());
	}
	return testGroup.release();
}